

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

mp_bitcnt_t mpz_make_odd(__mpz_struct *r)

{
  mp_bitcnt_t cnt;
  
  if (0 < r->_mp_size) {
    cnt = mpn_common_scan(*r->_mp_d,0,r->_mp_d,0,0);
    mpz_tdiv_q_2exp(r,r,cnt);
    return cnt;
  }
  __assert_fail("r->_mp_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0xabe,"mp_bitcnt_t mpz_make_odd(__mpz_struct *)");
}

Assistant:

static mp_bitcnt_t
mpz_make_odd (mpz_t r)
{
  mp_bitcnt_t shift;

  assert (r->_mp_size > 0);
  /* Count trailing zeros, equivalent to mpn_scan1, because we know that there is a 1 */
  shift = mpn_common_scan (r->_mp_d[0], 0, r->_mp_d, 0, 0);
  mpz_tdiv_q_2exp (r, r, shift);

  return shift;
}